

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void on_new_level(void)

{
  if ((player->upkeep->arena_level & 1U) == 0) {
    play_ambient_sound();
    target_set_monster((monster *)0x0);
    health_track(player->upkeep,(monster *)0x0);
  }
  disturb(player);
  if (player->max_lev < player->lev) {
    player->max_lev = player->lev;
  }
  if (player->max_depth < player->depth) {
    player->max_depth = player->depth;
  }
  event_signal(EVENT_MESSAGE_FLUSH);
  event_signal(EVENT_NEW_LEVEL_DISPLAY);
  player->upkeep->update = player->upkeep->update | 0x415;
  player->upkeep->notice = player->upkeep->notice | 1;
  notice_stuff(player);
  update_stuff(player);
  redraw_stuff(player);
  event_signal(EVENT_REFRESH);
  if ((player->upkeep->arena_level & 1U) == 0) {
    if (player->depth != 0) {
      display_feeling(false);
    }
    if (cave->ghost->bones_selector != L'\0') {
      if ((cave->ghost == (ghost_info *)0x0) || (cave->ghost->race == L'\0')) {
        __assert_fail("cave->ghost && cave->ghost->race",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-world.c"
                      ,0x481,"void on_new_level(void)");
      }
      ghost_challenge();
    }
    search(player);
    if ((int)player->energy < (int)(uint)z_info->move_energy) {
      player->energy = z_info->move_energy;
    }
  }
  return;
}

Assistant:

void on_new_level(void)
{
	/* Arena levels are not really a level change */
	if (!player->upkeep->arena_level) {
		/* Play ambient sound on change of level. */
		play_ambient_sound();

		/* Cancel the target */
		target_set_monster(0);

		/* Cancel the health bar */
		health_track(player->upkeep, NULL);
	}

	/* Disturb */
	disturb(player);

	/* Track maximum player level */
	if (player->max_lev < player->lev)
		player->max_lev = player->lev;

	/* Track maximum dungeon level */
	if (player->max_depth < player->depth)
		player->max_depth = player->depth;

	/* Flush messages */
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Update display */
	event_signal(EVENT_NEW_LEVEL_DISPLAY);

	/* Update player */
	player->upkeep->update |= (PU_BONUS | PU_HP | PU_SPELLS | PU_INVEN);
	player->upkeep->notice |= (PN_COMBINE);
	notice_stuff(player);
	update_stuff(player);
	redraw_stuff(player);

	/* Refresh */
	event_signal(EVENT_REFRESH);

	if (player->upkeep->arena_level) {
		return;
	}

	/* Announce (or repeat) the feeling */
	if (player->depth)
		display_feeling(false);

	/* Announce a player ghost challenge. -LM- */
	if (cave->ghost->bones_selector) {
		assert(cave->ghost && cave->ghost->race);
		ghost_challenge();
	}

	/* Check the surroundings */
	search(player);

	/* Give player minimum energy to start a new level, but do not reduce
	 * higher value from savefile for level in progress */
	if (player->energy < z_info->move_energy)
		player->energy = z_info->move_energy;
}